

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

int __thiscall libtorrent::rename(libtorrent *this,char *__old,char *__new)

{
  __type_conflict1 _Var1;
  int iVar2;
  char *__old_00;
  char *__new_00;
  int *piVar3;
  error_category *cat;
  undefined1 local_60 [8];
  native_path_string f2;
  native_path_string f1;
  error_code *ec_local;
  string *newf_local;
  string *inf_local;
  
  boost::system::error_code::clear((error_code *)__new);
  convert_to_native_path_string((native_path_string *)((long)&f2.field_2 + 8),(string *)this);
  convert_to_native_path_string((native_path_string *)local_60,(string *)__old);
  _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&f2.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60);
  if (!_Var1) {
    __old_00 = (char *)::std::__cxx11::string::c_str();
    __new_00 = (char *)::std::__cxx11::string::c_str();
    iVar2 = ::rename(__old_00,__new_00);
    if (iVar2 < 0) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      cat = boost::system::generic_category();
      boost::system::error_code::assign((error_code *)__new,iVar2,cat);
    }
  }
  ::std::__cxx11::string::~string((string *)local_60);
  iVar2 = ::std::__cxx11::string::~string((string *)(f2.field_2._M_local_buf + 8));
  return iVar2;
}

Assistant:

void rename(std::string const& inf, std::string const& newf, error_code& ec)
	{
		ec.clear();

		native_path_string f1 = convert_to_native_path_string(inf);
		native_path_string f2 = convert_to_native_path_string(newf);

		if (f1 == f2) return;

#if defined TORRENT_WINDOWS
#define RenameFunction_ ::_wrename
#else
#define RenameFunction_ ::rename
#endif

		if (RenameFunction_(f1.c_str(), f2.c_str()) < 0)
		{
			ec.assign(errno, generic_category());
		}
#undef RenameFunction_
	}